

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O3

bool cmUtilitySourceCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  cmValue cVar8;
  string *psVar9;
  cmState *this;
  char *pcVar10;
  long *plVar11;
  string *psVar12;
  size_type *psVar13;
  long *plVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string utilityDirectory;
  string exePath;
  string utilityExecutable;
  string utilitySource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_1a0;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  string local_160;
  string *local_140;
  cmExecutionStatus *local_138;
  long *local_130;
  long local_128;
  long local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined1 local_110 [32];
  pointer local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined8 local_d0;
  long *local_c8 [2];
  long local_b8 [2];
  string *local_a8;
  cmValue local_a0;
  ulong local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  psVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_98 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar12;
  if (local_98 < 0x41) {
    local_110._0_8_ = (string *)(local_110 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((string *)local_110._0_8_ == (string *)(local_110 + 0x10)) goto LAB_003d3765;
  }
  else {
    local_140 = psVar12;
    cVar8 = cmMakefile::GetDefinition(status->Makefile,psVar12);
    pcVar2 = status->Makefile;
    psVar12 = (string *)(local_110 + 0x10);
    local_138 = status;
    local_110._0_8_ = psVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CMAKE_CFG_INTDIR","");
    psVar9 = cmMakefile::GetRequiredDefinition(pcVar2,(string *)local_110);
    if ((string *)local_110._0_8_ != psVar12) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    pcVar2 = local_138->Makefile;
    local_110._0_8_ = psVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"CMAKE_CROSSCOMPILING","");
    bVar5 = cmMakefile::IsOn(pcVar2,(string *)local_110);
    if ((string *)local_110._0_8_ != psVar12) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    if (bVar5) {
      local_110._0_8_ = cVar8;
      iVar6 = cmValue::Compare((cmValue *)local_110,(cmValue)0x0);
      if (iVar6 != 0) goto LAB_003d3765;
      local_110._0_8_ = (string *)0x33;
      local_110._8_8_ = "UTILITY_SOURCE is used in cross compiling mode for ";
      local_110._16_8_ = 0;
      local_f0 = (local_140->_M_dataplus)._M_p;
      local_110._24_8_ = local_140->_M_string_length;
      local_e8 = 0;
      local_e0 = 0x9f;
      local_d8 = 
      ". If your intention is to run this executable, you need to preload the cache with the full path to a version of that program, which runs on this build machine."
      ;
      local_d0 = 0;
      views._M_len = 3;
      views._M_array = (iterator)local_110;
      cmCatViews(&local_1a0,views);
      cmSystemTools::Message(&local_1a0,"Warning");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this = cmMakefile::GetState(local_138->Makefile);
      if (((cVar8.Value != (string *)0x0) &&
          (((pcVar10 = strstr(((cVar8.Value)->_M_dataplus)._M_p,"(IntDir)"), pcVar10 == (char *)0x0
            || (iVar6 = std::__cxx11::string::compare((char *)psVar9), iVar6 == 0)) &&
           (uVar7 = cmState::GetCacheMajorVersion(this), uVar7 != 0)))) &&
         (uVar7 = cmState::GetCacheMinorVersion(this), uVar7 != 0)) goto LAB_003d3765;
    }
    psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_138->Makefile);
    pcVar3 = (psVar9->_M_dataplus)._M_p;
    local_110._0_8_ = psVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_110,pcVar3,pcVar3 + psVar9->_M_string_length);
    local_180 = &local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_110._0_8_,(char *)(local_110._8_8_ + local_110._0_8_));
    std::__cxx11::string::append((char *)&local_180);
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_180,(ulong)local_140[2]._M_dataplus._M_p);
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1a0.field_2._M_allocated_capacity = *psVar13;
      local_1a0.field_2._8_8_ = plVar11[3];
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar13;
      local_1a0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_1a0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_110,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
    }
    bVar5 = cmsys::SystemTools::FileExists((string *)local_110);
    if (bVar5) {
      local_a0.Value = local_140 + 1;
      local_a8 = local_140 + 2;
      psVar12 = local_140 + 3;
      do {
        pcVar4 = local_138;
        if (psVar12 ==
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          pcVar2 = local_138->Makefile;
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a0,"CMAKE_CFG_INTDIR","");
          psVar12 = cmMakefile::GetRequiredDefinition(pcVar2,&local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          psVar9 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4->Makefile);
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
          pcVar3 = (psVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a0,pcVar3,pcVar3 + psVar9->_M_string_length);
          local_180 = &local_170;
          local_178 = 0;
          local_170 = 0;
          pcVar2 = pcVar4->Makefile;
          paVar1 = &local_160.field_2;
          local_160._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_160,"EXECUTABLE_OUTPUT_PATH","");
          cVar8 = cmMakefile::GetDefinition(pcVar2,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar1) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if (cVar8.Value != (string *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_180);
          }
          if (local_178 == 0) {
            std::operator+(&local_160,"/",local_a8);
            std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_160._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_1a0);
          }
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,local_1a0._M_dataplus._M_p,
                     local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
          std::__cxx11::string::append((char *)local_c8);
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)local_c8,(ulong)(psVar12->_M_dataplus)._M_p);
          plVar14 = plVar11 + 2;
          if ((long *)*plVar11 == plVar14) {
            local_80 = *plVar14;
            lStack_78 = plVar11[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar14;
            local_90 = (long *)*plVar11;
          }
          local_88 = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
          plVar14 = plVar11 + 2;
          if ((long *)*plVar11 == plVar14) {
            local_60 = *plVar14;
            lStack_58 = plVar11[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar14;
            local_70 = (long *)*plVar11;
          }
          local_68 = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_70,(ulong)local_140[1]._M_dataplus._M_p);
          plVar14 = plVar11 + 2;
          if ((long *)*plVar11 == plVar14) {
            local_120 = *plVar14;
            uStack_118 = (undefined4)plVar11[3];
            uStack_114 = *(undefined4 *)((long)plVar11 + 0x1c);
            local_130 = &local_120;
          }
          else {
            local_120 = *plVar14;
            local_130 = (long *)*plVar11;
          }
          local_128 = plVar11[1];
          *plVar11 = (long)plVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          pcVar2 = pcVar4->Makefile;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"CMAKE_EXECUTABLE_SUFFIX","");
          psVar12 = (string *)cmMakefile::GetDefinition(pcVar2,&local_50);
          if (psVar12 == (string *)0x0) {
            psVar12 = &cmValue::Empty_abi_cxx11_;
          }
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_130,(ulong)(psVar12->_M_dataplus)._M_p);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          psVar13 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160.field_2._8_8_ = plVar11[3];
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar13;
            local_160._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_160._M_string_length = plVar11[1];
          *plVar11 = (long)psVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          pcVar4 = local_138;
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,local_60 + 1);
          }
          psVar12 = local_140;
          if (local_90 != &local_80) {
            operator_delete(local_90,local_80 + 1);
          }
          if (local_c8[0] != local_b8) {
            operator_delete(local_c8[0],local_b8[0] + 1);
          }
          cmsys::SystemTools::ReplaceString(&local_160,"/./","/");
          pcVar2 = pcVar4->Makefile;
          local_130 = &local_120;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"Path to an internal program.","");
          cmMakefile::AddCacheDefinition
                    (pcVar2,psVar12,&local_160,(string *)&local_130,FILEPATH,false);
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&local_160);
          pcVar2 = pcVar4->Makefile;
          local_130 = &local_120;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"Executable to project name.","");
          cmMakefile::AddCacheDefinition
                    (pcVar2,&local_160,local_a0,(string *)&local_130,INTERNAL,false);
          if (local_130 != &local_120) {
            operator_delete(local_130,local_120 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          break;
        }
        local_180 = &local_170;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,local_110._0_8_,(char *)(local_110._8_8_ + local_110._0_8_))
        ;
        std::__cxx11::string::append((char *)&local_180);
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_180,(ulong)(psVar12->_M_dataplus)._M_p);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1a0.field_2._M_allocated_capacity = *psVar13;
          local_1a0.field_2._8_8_ = plVar11[3];
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar13;
          local_1a0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_1a0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if (local_180 != &local_170) {
          operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
        }
        bVar5 = cmsys::SystemTools::FileExists(&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        psVar12 = psVar12 + 1;
      } while (bVar5);
    }
    if ((string *)local_110._0_8_ == (string *)(local_110 + 0x10)) goto LAB_003d3765;
  }
  operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
LAB_003d3765:
  return 0x40 < local_98;
}

Assistant:

bool cmUtilitySourceCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto arg = args.begin();

  // The first argument is the cache entry name.
  std::string const& cacheEntry = *arg++;
  cmValue cacheValue = status.GetMakefile().GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  std::string const& intDir =
    status.GetMakefile().GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (status.GetMakefile().IsOn("CMAKE_CROSSCOMPILING")) {
    haveCacheValue = (cacheValue != nullptr);
    if (!haveCacheValue) {
      std::string msg = cmStrCat(
        "UTILITY_SOURCE is used in cross compiling mode for ", cacheEntry,
        ". If your intention is to run this executable, you need to "
        "preload the cache with the full path to a version of that "
        "program, which runs on this build machine.");
      cmSystemTools::Message(msg, "Warning");
    }
  } else {
    cmState* state = status.GetMakefile().GetState();
    haveCacheValue = (cacheValue &&
                      (strstr(cacheValue->c_str(), "(IntDir)") == nullptr ||
                       (intDir == "$(IntDir)")) &&
                      (state->GetCacheMajorVersion() != 0 &&
                       state->GetCacheMinorVersion() != 0));
  }

  if (haveCacheValue) {
    return true;
  }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string const& utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string const& relativeSource = *arg++;
  std::string utilitySource = status.GetMakefile().GetCurrentSourceDirectory();
  utilitySource = utilitySource + "/" + relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if (!cmSystemTools::FileExists(utilitySource)) {
    return true;
  }

  // Make sure all the files exist in the source directory.
  while (arg != args.end()) {
    std::string file = utilitySource + "/" + *arg++;
    if (!cmSystemTools::FileExists(file)) {
      return true;
    }
  }

  // The source exists.
  const std::string& cmakeCFGout =
    status.GetMakefile().GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory =
    status.GetMakefile().GetCurrentBinaryDirectory();
  std::string exePath;
  if (cmValue d =
        status.GetMakefile().GetDefinition("EXECUTABLE_OUTPUT_PATH")) {
    exePath = *d;
  }
  if (!exePath.empty()) {
    utilityDirectory = exePath;
  } else {
    utilityDirectory += "/" + relativeSource;
  }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable = utilityDirectory + "/" + cmakeCFGout + "/" +
    utilityName +
    *status.GetMakefile().GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  status.GetMakefile().AddCacheDefinition(cacheEntry, utilityExecutable,
                                          "Path to an internal program.",
                                          cmStateEnums::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  status.GetMakefile().AddCacheDefinition(utilityExecutable, utilityName,
                                          "Executable to project name.",
                                          cmStateEnums::INTERNAL);

  return true;
}